

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O1

QDateTimeEditPrivate * __thiscall
QDateTimeEditPrivate::getMinimum(QDateTimeEditPrivate *this,QTimeZone *zone)

{
  long in_FS_OFFSET;
  QDate local_40;
  QTimeZone local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (((ulong)zone[0x7a].d & 0x40) == 0) {
    if ((*(int *)&zone[0xa1].d - 1U & 3) == 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        QDateTimeParser::getMinimum((QTimeZone *)this);
        return this;
      }
      goto LAB_003f002a;
    }
    QDate::QDate(&local_40,100,1,1);
    QDate::startOfDay(&local_38);
    QDateTime::toTimeZone((QTimeZone *)this);
  }
  else {
    ::QVariant::toDateTime();
    QDateTime::toTimeZone((QTimeZone *)this);
  }
  QDateTime::~QDateTime((QDateTime *)&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return this;
  }
LAB_003f002a:
  __stack_chk_fail();
}

Assistant:

QDateTime QDateTimeEditPrivate::getMinimum(const QTimeZone &zone) const
{
    if (keyboardTracking)
        return minimum.toDateTime().toTimeZone(zone);

    // QDTP's min is the local-time start of QDATETIMEEDIT_DATE_MIN, cached
    // (along with its conversion to UTC).
    if (timeZone.timeSpec() == Qt::LocalTime)
        return QDateTimeParser::getMinimum(zone);

    return QDATETIMEEDIT_DATE_MIN.startOfDay(timeZone).toTimeZone(zone);
}